

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

Am_Wrapper * quit_or_exit_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Widget_Look look;
  Am_Object widget;
  Am_String local_30;
  Am_Widget_Look local_24;
  Am_Object local_20;
  
  pAVar2 = Am_Object::Get(self,0x170,3);
  Am_Object::Am_Object(&local_20,pAVar2);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_20,0x17f,4);
    local_24.value = Am_MOTIF_LOOK_val;
    if ((pAVar2->type != 1) && (pAVar2->type != Am_Widget_Look::Am_Widget_Look_ID)) {
      Am_Widget_Look::TypeError(&local_24,pAVar2);
    }
    local_24.value = (Am_Widget_Look_vals)(pAVar2->value).float_value;
    if (Am_WINDOWS_LOOK.value == local_24.value) {
      Am_String::Am_String(&local_30,"Exit",true);
      pAVar3 = Am_String::operator_cast_to_Am_Wrapper_(&local_30);
      Am_String::~Am_String(&local_30);
      goto LAB_00240ee1;
    }
  }
  Am_String::Am_String(&local_30,"Quit",true);
  pAVar3 = Am_String::operator_cast_to_Am_Wrapper_(&local_30);
  Am_String::~Am_String(&local_30);
LAB_00240ee1:
  Am_Object::~Am_Object(&local_20);
  return pAVar3;
}

Assistant:

Am_Define_String_Formula(quit_or_exit)
{
  Am_Object widget = self.Get(Am_SAVED_OLD_OWNER, Am_RETURN_ZERO_ON_ERROR);
  if (widget.Valid()) {
    Am_Widget_Look look = widget.Get(Am_WIDGET_LOOK, Am_NO_DEPENDENCY);
    if (look == Am_WINDOWS_LOOK)
      return Am_String("Exit");
  }
  return Am_String("Quit");
}